

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O1

int testUpwardPass(void)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_ShapeRange *pAVar8;
  Type *pTVar9;
  TypeUnion this;
  Type *pTVar10;
  ConvolutionLayerParams *pCVar11;
  ValidPadding *this_00;
  WeightParams *pWVar12;
  InnerProductLayerParams *this_01;
  ShapeConstraint *this_02;
  ShapeRange *pSVar13;
  size_t sVar14;
  ostream *poVar15;
  int iVar16;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_03;
  int iVar17;
  RangeValue RVar18;
  Model m1;
  NeuralNetworkShaper shapes;
  string local_d8;
  Model local_b8;
  undefined1 local_88 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_50;
  
  CoreML::Specification::Model::Model(&local_b8);
  if (local_b8.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_b8.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 4;
  pTVar9->upperbound_ = 4;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 1;
  pTVar9->upperbound_ = 1;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 1;
  pTVar9->upperbound_ = -1;
  if (local_b8.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_b8.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_b8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_b8);
    local_b8._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_b8.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_03 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_b8.Type_.pipeline_)->models_;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_03,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar10,"conv_out");
  if (pTVar10->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 100;
    pCVar11 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar11);
    (pTVar10->layer_).convolution_ = pCVar11;
  }
  pCVar11 = (pTVar10->layer_).convolution_;
  pCVar11->outputchannels_ = 5;
  pCVar11->kernelchannels_ = 4;
  iVar17 = (pCVar11->kernelsize_).total_size_;
  if ((pCVar11->kernelsize_).current_size_ == iVar17) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar11->kernelsize_,iVar17 + 1);
  }
  iVar17 = (pCVar11->kernelsize_).current_size_;
  iVar16 = iVar17 + 1;
  (pCVar11->kernelsize_).current_size_ = iVar16;
  ((pCVar11->kernelsize_).rep_)->elements[iVar17] = 1;
  iVar17 = (pCVar11->kernelsize_).total_size_;
  if (iVar16 == iVar17) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar11->kernelsize_,iVar17 + 1);
  }
  iVar17 = (pCVar11->kernelsize_).current_size_;
  (pCVar11->kernelsize_).current_size_ = iVar17 + 1;
  ((pCVar11->kernelsize_).rep_)->elements[iVar17] = 10;
  if (pCVar11->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar11);
    pCVar11->_oneof_case_[0] = 0x32;
    this_00 = (ValidPadding *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding(this_00);
    (pCVar11->ConvolutionPaddingType_).valid_ = this_00;
  }
  pCVar11->hasbias_ = false;
  iVar17 = 200;
  do {
    if (pCVar11->weights_ == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar12);
      pCVar11->weights_ = pWVar12;
    }
    pWVar12 = pCVar11->weights_;
    iVar16 = (pWVar12->floatvalue_).total_size_;
    if ((pWVar12->floatvalue_).current_size_ == iVar16) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar12->floatvalue_,iVar16 + 1);
    }
    iVar16 = (pWVar12->floatvalue_).current_size_;
    (pWVar12->floatvalue_).current_size_ = iVar16 + 1;
    ((pWVar12->floatvalue_).rep_)->elements[iVar16] = 1.0;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_03,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"conv_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar10,"output");
  if (pTVar10->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (pTVar10->layer_).innerproduct_ = this_01;
  }
  pCVar11 = (pTVar10->layer_).convolution_;
  *(undefined8 *)&pCVar11->_kernelsize_cached_byte_size_ = 5;
  (pCVar11->stride_).current_size_ = 1;
  (pCVar11->stride_).total_size_ = 0;
  *(undefined1 *)&(pCVar11->stride_).rep_ = 0;
  iVar17 = 5;
  do {
    lVar2._0_4_ = (pCVar11->kernelsize_).current_size_;
    lVar2._4_4_ = (pCVar11->kernelsize_).total_size_;
    if (lVar2 == 0) {
      pWVar12 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar12);
      *(WeightParams **)&pCVar11->kernelsize_ = pWVar12;
    }
    lVar2 = *(long *)&pCVar11->kernelsize_;
    if (*(int *)(lVar2 + 0x10) == *(int *)(lVar2 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(lVar2 + 0x10),*(int *)(lVar2 + 0x14) + 1);
    }
    iVar16 = *(int *)(lVar2 + 0x10);
    *(int *)(lVar2 + 0x10) = iVar16 + 1;
    *(undefined4 *)(*(long *)(lVar2 + 0x18) + 8 + (long)iVar16 * 4) = 0x3f800000;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_88,&local_b8,true);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"input","");
  this_02 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_88,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pSVar13 = CoreML::ShapeConstraint::sequenceRange(this_02);
  sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
  if (sVar14 == 0) {
    pSVar13 = CoreML::ShapeConstraint::sequenceRange(this_02);
    RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
    local_d8._M_string_length = RVar18._val;
    local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
    bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
    if (bVar3) {
      pSVar13 = CoreML::ShapeConstraint::batchRange(this_02);
      sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
      if (sVar14 == 0) {
        pSVar13 = CoreML::ShapeConstraint::batchRange(this_02);
        RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
        local_d8._M_string_length = RVar18._val;
        local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
        bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
        if (bVar3) {
          pSVar13 = CoreML::ShapeConstraint::channelRange(this_02);
          sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
          if (sVar14 == 4) {
            pSVar13 = CoreML::ShapeConstraint::channelRange(this_02);
            RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
            local_d8._M_string_length = RVar18._val;
            local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
            sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
            if (sVar14 == 4) {
              pSVar13 = CoreML::ShapeConstraint::heightRange(this_02);
              sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
              if (sVar14 == 1) {
                pSVar13 = CoreML::ShapeConstraint::heightRange(this_02);
                RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                local_d8._M_string_length = RVar18._val;
                local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                if (sVar14 == 1) {
                  pSVar13 = CoreML::ShapeConstraint::widthRange(this_02);
                  sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                  if (sVar14 == 10) {
                    pSVar13 = CoreML::ShapeConstraint::widthRange(this_02);
                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                    local_d8._M_string_length = RVar18._val;
                    local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                    sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                    iVar17 = 0;
                    if (sVar14 == 10) goto LAB_0015cca7;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14d);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,"inShape.widthRange().maximumValue().value() == 10",0x31);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," was false, expected true.",0x1a);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,"inShape.widthRange().minimumValue() == 10",0x29);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," was false, expected true.",0x1a);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             ,0x68);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14a);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"inShape.heightRange().maximumValue().value() == 1",0x31);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15," was false, expected true.",0x1a);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x149);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,"inShape.heightRange().minimumValue() == 1",0x29);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15," was false, expected true.",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                         ,0x68);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x147);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"inShape.channelRange().maximumValue().value() == 4",0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," was false, expected true.",0x1a);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x146);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"inShape.channelRange().minimumValue() == 4",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," was false, expected true.",0x1a);
          }
          iVar17 = 1;
          std::endl<char,std::char_traits<char>>(poVar15);
          goto LAB_0015cca7;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x144);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"inShape.batchRange().maximumValue().isUnbound()",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x143);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"inShape.batchRange().minimumValue() == 0",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x141);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"inShape.sequenceRange().maximumValue().isUnbound()",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x140);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"inShape.sequenceRange().minimumValue() == 0",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  std::ostream::put((char)poVar15);
  iVar17 = 1;
  std::ostream::flush();
LAB_0015cca7:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_88 + 8));
  CoreML::Specification::Model::~Model(&local_b8);
  return iVar17;
}

Assistant:

int testUpwardPass() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(1);
    shape2->set_upperbound(1);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(1);
    shape3->set_upperbound(-1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("conv_out");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(1);
    convParams->add_kernelsize(10);
    convParams->mutable_valid();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*10; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    Specification::NeuralNetworkLayer *ipLayer = nn->add_layers();
    ipLayer->add_input("conv_out");
    ipLayer->add_output("output");
    Specification::InnerProductLayerParams *ipParams = ipLayer->mutable_innerproduct();
    ipParams->set_inputchannels(5);
    ipParams->set_outputchannels(1);
    ipParams->set_hasbias(false);
    for (int i = 0; i < 5; i++) {
        ipParams->mutable_weights()->add_floatvalue(1.0);
    }

    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());

    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 1);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 1);

    ML_ASSERT(inShape.widthRange().minimumValue() == 10);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 10);
    
    return 0;
    
}